

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DRender.cpp
# Opt level: O0

void distributed_render_scene
               (Scene *scene,double half_width,double half_height,int nx,int ny,int nx_sub,
               int ny_sub,char *fname)

{
  double dVar1;
  double dVar2;
  double this;
  int iVar3;
  pointer pTVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  rgb local_148 [2];
  Vector local_140;
  Vector local_128;
  Color local_110;
  int local_f8;
  int local_f4;
  int jSub;
  int iSub;
  double y1;
  double x1;
  rgb local_cb;
  rgb c;
  __single_object tga;
  Vector color;
  int local_a0;
  int primary_samples;
  int j;
  int i;
  double hy_sub;
  double hx_sub;
  double hy;
  double hx;
  Ray ray;
  double y;
  double x;
  char *fname_local;
  int ny_sub_local;
  int nx_sub_local;
  int ny_local;
  int nx_local;
  double half_height_local;
  double half_width_local;
  Scene *scene_local;
  
  x = (double)fname;
  fname_local._0_4_ = ny_sub;
  fname_local._4_4_ = nx_sub;
  ny_sub_local = ny;
  nx_sub_local = nx;
  _ny_local = half_height;
  half_height_local = half_width;
  half_width_local = (double)scene;
  Ray::Ray((Ray *)&hx);
  dVar5 = (half_height_local + half_height_local) / (double)nx_sub_local;
  dVar6 = (_ny_local + _ny_local) / (double)ny_sub_local;
  dVar11 = (double)fname_local._4_4_;
  dVar12 = (double)(int)fname_local;
  iVar3 = fname_local._4_4_ * (int)fname_local;
  Vector::Vector((Vector *)&tga);
  std::make_unique<TargaImage,char_const*&,int&,int&>
            ((char **)&stack0xffffffffffffff38,(int *)&x,&nx_sub_local);
  rgb::rgb(&local_cb,'\0');
  ray.dir.z = _ny_local;
  for (primary_samples = 0; primary_samples < ny_sub_local; primary_samples = primary_samples + 1) {
    y = -half_height_local;
    for (local_a0 = 0; local_a0 < nx_sub_local; local_a0 = local_a0 + 1) {
      y1 = dVar5 * -0.5 + y;
      _jSub = dVar6 * -0.5 + ray.dir.z;
      Vector::operator=((Vector *)&tga,0.0);
      TotalPixels = TotalPixels + 1;
      for (local_f4 = 0; local_f4 < fname_local._4_4_; local_f4 = local_f4 + 1) {
        for (local_f8 = 0; this = half_width_local, dVar2 = y1, local_f8 < (int)fname_local;
            local_f8 = local_f8 + 1) {
          dVar7 = (double)local_f4;
          dVar8 = rnd();
          dVar1 = _jSub;
          dVar9 = (double)local_f8;
          dVar10 = rnd();
          Scene::camera((Scene *)this,(dVar5 / dVar11) * (dVar7 + dVar8) + dVar2,
                        (dVar6 / dVar12) * (dVar9 + dVar10) + dVar1,(Ray *)&hx);
          Scene::trace(&local_110,(Scene *)half_width_local,&Grayzer::Medium::air,1.0,(Ray *)&hx);
          Vector::operator+=((Vector *)&tga,&local_110);
        }
      }
      Vector::operator/=((Vector *)&tga,(double)iVar3);
      Vector::Vector(&local_128,(Vector *)&tga);
      clip(&local_140,&local_128);
      local_cb.g = (uint8_t)(int)(color.x * 255.0);
      local_cb.r = (uint8_t)(int)((double)tga._M_t.
                                          super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>
                                          .super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl *
                                 255.0);
      local_cb.b = (uint8_t)(int)(color.y * 255.0);
      pTVar4 = std::unique_ptr<TargaImage,_std::default_delete<TargaImage>_>::operator->
                         ((unique_ptr<TargaImage,_std::default_delete<TargaImage>_> *)
                          &stack0xffffffffffffff38);
      local_148[0] = (rgb)CONCAT12(local_cb.b,local_cb._0_2_);
      (*(pTVar4->super_Image)._vptr_Image[3])(pTVar4,CONCAT53(0,local_148[0]));
      y = dVar5 + y;
    }
    ray.dir.z = ray.dir.z - dVar6;
  }
  std::unique_ptr<TargaImage,_std::default_delete<TargaImage>_>::~unique_ptr
            ((unique_ptr<TargaImage,_std::default_delete<TargaImage>_> *)&stack0xffffffffffffff38);
  return;
}

Assistant:

void distributed_render_scene(
   Scene* scene,
   double half_width, double half_height,
   int   nx,   int   ny,
   int   nx_sub,  int   ny_sub,
   char const* fname )
{
   double x,y;                // sample point
   Ray   ray;                 // pixel ray
   double hx = 2.0   * half_width / nx;      // pixel width
   double hy = 2.0   * half_height /   ny;      // pixel height
   double hx_sub =   hx / nx_sub;         // hz subdivision
   double hy_sub =   hy / ny_sub;         // vt subdivision
   int   i,j;
   int   primary_samples   = nx_sub * ny_sub; // # of samples for each  pixel
   Vector color;

   // make  next in  some higher-level module as: RenderOutFile = new Targa...
   auto tga = std::make_unique<TargaImage>( fname,nx,ny );
   rgb   c;

   for( i = 0, y =   half_height; i < ny; i++, y   -= hy )
   {
      for( j = 0, x =   -half_width; j < nx; j++, x   += hx )
      {
         double x1 = x -   0.5   * hx;
         double y1 = y -   0.5   * hy;
         color =  0;

         TotalPixels++;

         for( int iSub =   0; iSub  < nx_sub; iSub++ )
            for( int jSub =   0; jSub  < ny_sub; jSub++ )
            {
               scene->camera(x1 + hx_sub * (iSub + rnd()),
                     y1 +  hy_sub * (jSub + rnd()), ray );
               color += scene->trace(Grayzer::Medium::air, 1.0, ray);
            }
         color /= primary_samples;
         clip(color);

         c.r   = color.x * 255;
         c.g   = color.y * 255;
         c.b   = color.z * 255;

         tga->put_pixel(c);
      }
   }
}